

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::AddElement(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
             *this,RTPIPv6Destination *elem)

{
  HashElement *pHVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  in_port_t iVar7;
  uint32_t uVar8;
  bool bVar9;
  int iVar10;
  HashElement *pHVar11;
  HashElement **ppHVar12;
  HashElement **ppHVar13;
  
  iVar10 = RTPUDPv6Trans_GetHashIndex_IPv6Dest::GetIndex(elem);
  if (0x207c < iVar10) {
    return -6;
  }
  ppHVar12 = this->table + iVar10;
  bVar9 = false;
  ppHVar13 = ppHVar12;
  do {
    pHVar1 = *ppHVar13;
    do {
      if ((bVar9 != false) || (pHVar1 == (HashElement *)0x0)) {
        if (bVar9 == false) {
          pHVar11 = (HashElement *)
                    operator_new(0x60,(this->super_RTPMemoryObject).mgr,this->memorytype);
          iVar7 = (elem->rtpaddr).sin6_port;
          uVar8 = (elem->rtpaddr).sin6_flowinfo;
          uVar2 = *(undefined8 *)&(elem->rtpaddr).sin6_addr.__in6_u;
          uVar3 = *(undefined8 *)((long)&(elem->rtpaddr).sin6_addr.__in6_u + 8);
          uVar4 = *(undefined8 *)&(elem->rtpaddr).sin6_scope_id;
          uVar5 = *(undefined8 *)&(elem->rtcpaddr).sin6_flowinfo;
          uVar6 = *(undefined8 *)((long)&(elem->rtcpaddr).sin6_addr.__in6_u + 4);
          (pHVar11->element).rtpaddr.sin6_family = (elem->rtpaddr).sin6_family;
          (pHVar11->element).rtpaddr.sin6_port = iVar7;
          (pHVar11->element).rtpaddr.sin6_flowinfo = uVar8;
          *(undefined8 *)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u = uVar2;
          *(undefined8 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 8) = uVar3;
          *(undefined8 *)&(pHVar11->element).rtpaddr.sin6_scope_id = uVar4;
          *(undefined8 *)&(pHVar11->element).rtcpaddr.sin6_flowinfo = uVar5;
          *(undefined8 *)((long)&(pHVar11->element).rtcpaddr.sin6_addr.__in6_u + 4) = uVar6;
          *(undefined8 *)((long)&(pHVar11->element).rtcpaddr.sin6_addr.__in6_u + 0xc) =
               *(undefined8 *)((long)&(elem->rtcpaddr).sin6_addr.__in6_u + 0xc);
          pHVar11->listprev = (HashElement *)0x0;
          pHVar11->listnext = (HashElement *)0x0;
          pHVar11->hashprev = (HashElement *)0x0;
          pHVar11->hashnext = (HashElement *)0x0;
          pHVar11->hashindex = iVar10;
          pHVar1 = *ppHVar12;
          *ppHVar12 = pHVar11;
          pHVar11->hashnext = pHVar1;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar1->hashprev = pHVar11;
          }
          if (this->firsthashelem == (HashElement *)0x0) {
            this->firsthashelem = pHVar11;
          }
          else {
            pHVar1 = this->lasthashelem;
            pHVar1->listnext = pHVar11;
            pHVar11->listprev = pHVar1;
          }
          this->lasthashelem = pHVar11;
          return 0;
        }
        return -4;
      }
      bVar9 = RTPIPv6Destination::operator==(&pHVar1->element,elem);
    } while (bVar9);
    ppHVar13 = &pHVar1->hashnext;
  } while( true );
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::AddElement(const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(elem);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetElement() == elem)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_HASHTABLE_ELEMENTALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}